

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa.c
# Opt level: O1

edata_t * duckdb_je_pa_alloc(tsdn_t *tsdn,pa_shard_t *shard,size_t size,size_t alignment,_Bool slab,
                            szind_t szind,_Bool zero,_Bool guarded,_Bool *deferred_work_generated)

{
  edata_t *edata;
  
  if ((guarded) || (((shard->use_hpa).repr & 1U) == 0)) {
    edata = (edata_t *)0x0;
  }
  else {
    edata = (*(shard->hpa_sec).pai.alloc)
                      (tsdn,&(shard->hpa_sec).pai,size,alignment,zero,false,slab,
                       deferred_work_generated);
  }
  if (edata == (edata_t *)0x0) {
    edata = (*(shard->pac).pai.alloc)
                      (tsdn,&(shard->pac).pai,size,alignment,zero,guarded,slab,
                       deferred_work_generated);
  }
  if (edata != (edata_t *)0x0) {
    LOCK();
    (shard->nactive).repr = (shard->nactive).repr + (size >> 0xc);
    UNLOCK();
    duckdb_je_emap_remap(tsdn,shard->emap,edata,szind,slab);
    edata->e_bits = (ulong)slab << 0xc | (ulong)szind << 0x14 | edata->e_bits & 0xfffffffff00fefff;
    if (0x2000 < size && slab) {
      duckdb_je_emap_register_interior(tsdn,shard->emap,edata,szind);
    }
  }
  return edata;
}

Assistant:

edata_t *
pa_alloc(tsdn_t *tsdn, pa_shard_t *shard, size_t size, size_t alignment,
    bool slab, szind_t szind, bool zero, bool guarded,
    bool *deferred_work_generated) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);
	assert(!guarded || alignment <= PAGE);

	edata_t *edata = NULL;
	if (!guarded && pa_shard_uses_hpa(shard)) {
		edata = pai_alloc(tsdn, &shard->hpa_sec.pai, size, alignment,
		    zero, /* guarded */ false, slab, deferred_work_generated);
	}
	/*
	 * Fall back to the PAC if the HPA is off or couldn't serve the given
	 * allocation request.
	 */
	if (edata == NULL) {
		edata = pai_alloc(tsdn, &shard->pac.pai, size, alignment, zero,
		    guarded, slab, deferred_work_generated);
	}
	if (edata != NULL) {
		assert(edata_size_get(edata) == size);
		pa_nactive_add(shard, size >> LG_PAGE);
		emap_remap(tsdn, shard->emap, edata, szind, slab);
		edata_szind_set(edata, szind);
		edata_slab_set(edata, slab);
		if (slab && (size > 2 * PAGE)) {
			emap_register_interior(tsdn, shard->emap, edata, szind);
		}
		assert(edata_arena_ind_get(edata) == shard->ind);
	}
	return edata;
}